

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_sha256.c
# Opt level: O2

int tc_sha256_final(uint8_t *digest,TCSha256State_t s)

{
  uint8_t *data;
  uint8_t *to;
  uint uVar1;
  size_t sVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  
  if (digest == (uint8_t *)0x0 || s == (TCSha256State_t)0x0) {
    puts("tc_sha256_final failed, input sanity check.");
    iVar3 = 0;
  }
  else {
    sVar2 = s->leftover_offset;
    s->bits_hashed = s->bits_hashed + sVar2 * 8;
    data = s->leftover;
    s->leftover_offset = sVar2 + 1;
    s->leftover[sVar2] = 0x80;
    uVar4 = s->leftover_offset;
    if (0x38 < uVar4) {
      to = data + uVar4;
      iVar3 = (int)uVar4;
      uVar4 = 0;
      _set(to,'\0',0x40 - iVar3);
      compress(s->iv,data);
      s->leftover_offset = 0;
    }
    _set(data + uVar4,'\0',0x38 - (int)uVar4);
    uVar4 = s->bits_hashed;
    *(ulong *)(s->leftover + 0x38) =
         uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
         (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
         (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
    compress(s->iv,data);
    for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
      uVar1 = s->iv[lVar5];
      *(uint *)(digest + lVar5 * 4) =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    }
    _set(s,'\0',0x70);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int tc_sha256_final(uint8_t *digest, TCSha256State_t s)
{
	unsigned int i;

	/* input sanity check: */
	if (digest == (uint8_t *) 0 ||
	    s == (TCSha256State_t) 0) {
                printf("tc_sha256_final failed, input sanity check.\n");
		return TC_CRYPTO_FAIL;
	}

	s->bits_hashed += (s->leftover_offset << 3);

	s->leftover[s->leftover_offset++] = 0x80; /* always room for one byte */
	if (s->leftover_offset > (sizeof(s->leftover) - 8)) {
		/* there is not room for all the padding in this block */
		_set(s->leftover + s->leftover_offset, 0x00,
		     sizeof(s->leftover) - s->leftover_offset);
		compress(s->iv, s->leftover);
		s->leftover_offset = 0;
	}

	/* add the padding and the length in big-Endian format */
	_set(s->leftover + s->leftover_offset, 0x00,
	     sizeof(s->leftover) - 8 - s->leftover_offset);
	s->leftover[sizeof(s->leftover) - 1] = (uint8_t)(s->bits_hashed);
	s->leftover[sizeof(s->leftover) - 2] = (uint8_t)(s->bits_hashed >> 8);
	s->leftover[sizeof(s->leftover) - 3] = (uint8_t)(s->bits_hashed >> 16);
	s->leftover[sizeof(s->leftover) - 4] = (uint8_t)(s->bits_hashed >> 24);
	s->leftover[sizeof(s->leftover) - 5] = (uint8_t)(s->bits_hashed >> 32);
	s->leftover[sizeof(s->leftover) - 6] = (uint8_t)(s->bits_hashed >> 40);
	s->leftover[sizeof(s->leftover) - 7] = (uint8_t)(s->bits_hashed >> 48);
	s->leftover[sizeof(s->leftover) - 8] = (uint8_t)(s->bits_hashed >> 56);

	/* hash the padding and length */
	compress(s->iv, s->leftover);

	/* copy the iv out to digest */
	for (i = 0; i < TC_SHA256_STATE_BLOCKS; ++i) {
		unsigned int t = *((unsigned int *) &s->iv[i]);
		*digest++ = (uint8_t)(t >> 24);
		*digest++ = (uint8_t)(t >> 16);
		*digest++ = (uint8_t)(t >> 8);
		*digest++ = (uint8_t)(t);
	}

	/* destroy the current state */
	_set(s, 0, sizeof(*s));

	return TC_CRYPTO_SUCCESS;
}